

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::IsUSDZ(string *filename)

{
  bool bVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string err;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  string local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  bVar2 = false;
  bVar1 = io::ReadFileHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                             &local_28,(string *)filename,0x100,(void *)0x0);
  if (bVar1) {
    bVar2 = IsUSDZ(local_48._M_impl.super__Vector_impl_data._M_start,
                   (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::__cxx11::string::_M_dispose();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return bVar2;
}

Assistant:

bool IsUSDZ(const std::string &filename) {
  // TODO: Read first few bytes and check the magic number.
  //
  std::vector<uint8_t> data;
  std::string err;
  // 256 bytes may be enough.
  if (!io::ReadFileHeader(&data, &err, filename, 256,
                          /* userdata */ nullptr)) {
    return false;
  }

  return IsUSDZ(data.data(), data.size());
}